

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_zip_read(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  SyArchive *pArch;
  sxi32 rc;
  SyArchive *pArchive;
  SyArchiveEntry *pNext;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pArchive = (SyArchive *)0x0;
  pNext = (SyArchiveEntry *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,1,"Expecting a ZIP archive");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    pArch = (SyArchive *)jx9_value_to_resource(*(jx9_value **)pNext);
    if ((pArch == (SyArchive *)0x0) || (pArch->nMagic != 0xdead635a)) {
      jx9_context_throw_error(pjStack_18,1,"Expecting a ZIP archive");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      sVar2 = SyArchiveGetNextEntry(pArch,(SyArchiveEntry **)&pArchive);
      if (sVar2 == 0) {
        jx9_result_resource(pjStack_18,pArchive);
        *(SyArchive **)&pArchive[1].nCentralSize = pArch + 1;
      }
      else {
        jx9_result_bool(pjStack_18,0);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_zip_read(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pNext = 0; /* cc warning */
	SyArchive *pArchive;
	sxi32 rc;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the in-memory archive */
	pArchive = (SyArchive *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid ZIP archive */
	if( SXARCH_INVALID(pArchive) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the next entry */
	rc = SyArchiveGetNextEntry(pArchive, &pNext);
	if( rc != SXRET_OK ){
		/* No more entries in the central directory, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return as a resource handle */
		jx9_result_resource(pCtx, pNext);
		/* Point to the ZIP raw data */
		pNext->pUserData = (void *)&pArchive[1];
	}
	return JX9_OK;
}